

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall
diligent_spirv_cross::Compiler::InterfaceVariableAccessHandler::handle
          (InterfaceVariableAccessHandler *this,Op opcode,uint32_t *args,uint32_t length)

{
  int iVar1;
  uint32_t uVar2;
  undefined8 in_RAX;
  SPIRVariable *pSVar3;
  SPIRExtension *pSVar4;
  bool bVar5;
  uint32_t i;
  ulong uVar6;
  _Insert<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
  *this_00;
  undefined8 uStack_38;
  
  bVar5 = true;
  uStack_38 = in_RAX;
  switch(opcode) {
  case OpAtomicLoad:
  case OpAtomicExchange:
  case OpAtomicCompareExchange:
  case OpAtomicCompareExchangeWeak:
  case OpAtomicIIncrement:
  case OpAtomicIDecrement:
  case OpAtomicIAdd:
  case OpAtomicISub:
  case OpAtomicSMin:
  case OpAtomicUMin:
  case OpAtomicSMax:
  case OpAtomicUMax:
  case OpAtomicAnd:
  case OpAtomicOr:
  case OpAtomicXor:
switchD_0068b957_caseD_e3:
    if (2 < length) {
      args = args + 2;
LAB_0068b9d8:
      uVar2 = *args;
      if (uVar2 == 0) {
        return true;
      }
      pSVar3 = maybe_get<diligent_spirv_cross::SPIRVariable>(this->compiler,uVar2);
      if (pSVar3 == (SPIRVariable *)0x0) {
        return true;
      }
      if (StorageBuffer < pSVar3->storage) {
        return true;
      }
      if ((0x160fU >> (pSVar3->storage & 0x1f) & 1) == 0) {
        return true;
      }
      this_00 = (_Insert<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                 *)this->variables;
      uStack_38 = CONCAT44(uVar2,(undefined4)uStack_38);
LAB_0068ba0c:
      ::std::__detail::
      _Insert<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
      ::insert(this_00,(value_type *)((long)&uStack_38 + 4));
      return true;
    }
    break;
  case OpAtomicStore:
switchD_0068b957_caseD_e4:
    if (length != 0) goto LAB_0068b9d8;
    break;
  case OpAtomicXor|OpUndef:
  case OpAtomicAnd|OpSourceExtension:
    goto switchD_0068b957_caseD_f3;
  case OpPhi:
    if (1 < length) {
      for (uVar6 = 0; uVar6 < length - 2; uVar6 = uVar6 + 2) {
        pSVar3 = maybe_get<diligent_spirv_cross::SPIRVariable>(this->compiler,args[uVar6 + 2]);
        if (((pSVar3 != (SPIRVariable *)0x0) && (pSVar3->storage < (StorageBuffer|Input))) &&
           ((0x160fU >> (pSVar3->storage & 0x1f) & 1) != 0)) {
          uStack_38 = CONCAT44(args[uVar6 + 2],(undefined4)uStack_38);
          ::std::__detail::
          _Insert<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
          ::insert((_Insert<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                    *)this->variables,(value_type *)((long)&uStack_38 + 4));
        }
      }
      return true;
    }
    break;
  default:
    switch(opcode) {
    case OpFunctionCall:
      if (2 < length) {
        for (uVar6 = 0; length - 3 != uVar6; uVar6 = uVar6 + 1) {
          pSVar3 = maybe_get<diligent_spirv_cross::SPIRVariable>(this->compiler,args[uVar6 + 3]);
          if (((pSVar3 != (SPIRVariable *)0x0) && (pSVar3->storage < (StorageBuffer|Input))) &&
             ((0x160fU >> (pSVar3->storage & 0x1f) & 1) != 0)) {
            uStack_38 = CONCAT44(args[uVar6 + 3],(undefined4)uStack_38);
            ::std::__detail::
            _Insert<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
            ::insert((_Insert<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                      *)this->variables,(value_type *)((long)&uStack_38 + 4));
          }
        }
        return true;
      }
      break;
    case OpFunctionEnd|OpSourceContinued:
    case OpVariable:
    case OpCopyMemorySized:
      goto switchD_0068b957_caseD_f3;
    case OpImageTexelPointer:
    case OpLoad:
    case OpAccessChain:
    case OpInBoundsAccessChain:
    case OpPtrAccessChain:
    case OpArrayLength:
      goto switchD_0068b957_caseD_e3;
    case OpStore:
      goto switchD_0068b957_caseD_e4;
    case OpCopyMemory:
      if (1 < length) {
        pSVar3 = maybe_get<diligent_spirv_cross::SPIRVariable>(this->compiler,*args);
        if (((pSVar3 != (SPIRVariable *)0x0) && (pSVar3->storage < (StorageBuffer|Input))) &&
           ((0x160fU >> (pSVar3->storage & 0x1f) & 1) != 0)) {
          uStack_38 = CONCAT44(*args,(undefined4)uStack_38);
          ::std::__detail::
          _Insert<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
          ::insert((_Insert<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                    *)this->variables,(value_type *)((long)&uStack_38 + 4));
        }
        pSVar3 = maybe_get<diligent_spirv_cross::SPIRVariable>(this->compiler,args[1]);
        if (pSVar3 == (SPIRVariable *)0x0) {
          return true;
        }
        if (StorageBuffer < pSVar3->storage) {
          return true;
        }
        if ((0x160fU >> (pSVar3->storage & 0x1f) & 1) == 0) {
          return true;
        }
        this_00 = (_Insert<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                   *)this->variables;
        uVar2 = args[1];
LAB_0068bc32:
        uStack_38 = CONCAT44(uVar2,(undefined4)uStack_38);
        goto LAB_0068ba0c;
      }
      break;
    default:
      if (opcode == OpExtInst) {
        if (2 < length) {
          pSVar4 = get<diligent_spirv_cross::SPIRExtension>(this->compiler,args[2]);
          iVar1 = *(int *)&(pSVar4->super_IVariant).field_0xc;
          if (iVar1 == 4) {
            if (args[3] != 1) {
              return true;
            }
          }
          else {
            if (iVar1 != 1) {
              return true;
            }
            uVar2 = args[3];
            if (2 < uVar2 - 0x4c) {
              if ((uVar2 != 10) && (uVar2 != 0x23)) {
                return true;
              }
              pSVar3 = maybe_get<diligent_spirv_cross::SPIRVariable>(this->compiler,args[5]);
              if (pSVar3 == (SPIRVariable *)0x0) {
                return true;
              }
              if (StorageBuffer < pSVar3->storage) {
                return true;
              }
              if ((0x160fU >> (pSVar3->storage & 0x1f) & 1) == 0) {
                return true;
              }
              this_00 = (_Insert<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                         *)this->variables;
              uVar2 = args[5];
              goto LAB_0068bc32;
            }
          }
          pSVar3 = maybe_get<diligent_spirv_cross::SPIRVariable>(this->compiler,args[4]);
          if (pSVar3 == (SPIRVariable *)0x0) {
            return true;
          }
          if (StorageBuffer < pSVar3->storage) {
            return true;
          }
          if ((0x160fU >> (pSVar3->storage & 0x1f) & 1) == 0) {
            return true;
          }
          this_00 = (_Insert<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                     *)this->variables;
          uVar2 = args[4];
          goto LAB_0068bc32;
        }
      }
      else {
        if (opcode == OpCopyObject) goto switchD_0068b957_caseD_e3;
        if (opcode != OpSelect) {
          return true;
        }
        if (4 < length) {
          for (uVar6 = 0; length - 3 != uVar6; uVar6 = uVar6 + 1) {
            pSVar3 = maybe_get<diligent_spirv_cross::SPIRVariable>(this->compiler,args[uVar6 + 3]);
            if (((pSVar3 != (SPIRVariable *)0x0) && (pSVar3->storage < (StorageBuffer|Input))) &&
               ((0x160fU >> (pSVar3->storage & 0x1f) & 1) != 0)) {
              uStack_38 = CONCAT44(args[uVar6 + 3],(undefined4)uStack_38);
              ::std::__detail::
              _Insert<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
              ::insert((_Insert<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                        *)this->variables,(value_type *)((long)&uStack_38 + 4));
            }
          }
          return true;
        }
      }
    }
  }
  bVar5 = false;
switchD_0068b957_caseD_f3:
  return bVar5;
}

Assistant:

bool Compiler::InterfaceVariableAccessHandler::handle(Op opcode, const uint32_t *args, uint32_t length)
{
	uint32_t variable = 0;
	switch (opcode)
	{
	// Need this first, otherwise, GCC complains about unhandled switch statements.
	default:
		break;

	case OpFunctionCall:
	{
		// Invalid SPIR-V.
		if (length < 3)
			return false;

		uint32_t count = length - 3;
		args += 3;
		for (uint32_t i = 0; i < count; i++)
		{
			auto *var = compiler.maybe_get<SPIRVariable>(args[i]);
			if (var && storage_class_is_interface(var->storage))
				variables.insert(args[i]);
		}
		break;
	}

	case OpSelect:
	{
		// Invalid SPIR-V.
		if (length < 5)
			return false;

		uint32_t count = length - 3;
		args += 3;
		for (uint32_t i = 0; i < count; i++)
		{
			auto *var = compiler.maybe_get<SPIRVariable>(args[i]);
			if (var && storage_class_is_interface(var->storage))
				variables.insert(args[i]);
		}
		break;
	}

	case OpPhi:
	{
		// Invalid SPIR-V.
		if (length < 2)
			return false;

		uint32_t count = length - 2;
		args += 2;
		for (uint32_t i = 0; i < count; i += 2)
		{
			auto *var = compiler.maybe_get<SPIRVariable>(args[i]);
			if (var && storage_class_is_interface(var->storage))
				variables.insert(args[i]);
		}
		break;
	}

	case OpAtomicStore:
	case OpStore:
		// Invalid SPIR-V.
		if (length < 1)
			return false;
		variable = args[0];
		break;

	case OpCopyMemory:
	{
		if (length < 2)
			return false;

		auto *var = compiler.maybe_get<SPIRVariable>(args[0]);
		if (var && storage_class_is_interface(var->storage))
			variables.insert(args[0]);

		var = compiler.maybe_get<SPIRVariable>(args[1]);
		if (var && storage_class_is_interface(var->storage))
			variables.insert(args[1]);
		break;
	}

	case OpExtInst:
	{
		if (length < 3)
			return false;
		auto &extension_set = compiler.get<SPIRExtension>(args[2]);
		switch (extension_set.ext)
		{
		case SPIRExtension::GLSL:
		{
			auto op = static_cast<GLSLstd450>(args[3]);

			switch (op)
			{
			case GLSLstd450InterpolateAtCentroid:
			case GLSLstd450InterpolateAtSample:
			case GLSLstd450InterpolateAtOffset:
			{
				auto *var = compiler.maybe_get<SPIRVariable>(args[4]);
				if (var && storage_class_is_interface(var->storage))
					variables.insert(args[4]);
				break;
			}

			case GLSLstd450Modf:
			case GLSLstd450Fract:
			{
				auto *var = compiler.maybe_get<SPIRVariable>(args[5]);
				if (var && storage_class_is_interface(var->storage))
					variables.insert(args[5]);
				break;
			}

			default:
				break;
			}
			break;
		}
		case SPIRExtension::SPV_AMD_shader_explicit_vertex_parameter:
		{
			enum AMDShaderExplicitVertexParameter
			{
				InterpolateAtVertexAMD = 1
			};

			auto op = static_cast<AMDShaderExplicitVertexParameter>(args[3]);

			switch (op)
			{
			case InterpolateAtVertexAMD:
			{
				auto *var = compiler.maybe_get<SPIRVariable>(args[4]);
				if (var && storage_class_is_interface(var->storage))
					variables.insert(args[4]);
				break;
			}

			default:
				break;
			}
			break;
		}
		default:
			break;
		}
		break;
	}

	case OpAccessChain:
	case OpInBoundsAccessChain:
	case OpPtrAccessChain:
	case OpLoad:
	case OpCopyObject:
	case OpImageTexelPointer:
	case OpAtomicLoad:
	case OpAtomicExchange:
	case OpAtomicCompareExchange:
	case OpAtomicCompareExchangeWeak:
	case OpAtomicIIncrement:
	case OpAtomicIDecrement:
	case OpAtomicIAdd:
	case OpAtomicISub:
	case OpAtomicSMin:
	case OpAtomicUMin:
	case OpAtomicSMax:
	case OpAtomicUMax:
	case OpAtomicAnd:
	case OpAtomicOr:
	case OpAtomicXor:
	case OpArrayLength:
		// Invalid SPIR-V.
		if (length < 3)
			return false;
		variable = args[2];
		break;
	}

	if (variable)
	{
		auto *var = compiler.maybe_get<SPIRVariable>(variable);
		if (var && storage_class_is_interface(var->storage))
			variables.insert(variable);
	}
	return true;
}